

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

completion * __thiscall
mjs::interpreter::impl::operator()
          (completion *__return_storage_ptr__,impl *this,expression_statement *s)

{
  value vStack_68;
  value local_40;
  
  eval(&local_40,this,
       (s->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
  get_value(&vStack_68,this,&local_40);
  completion::completion(__return_storage_ptr__,&vStack_68,normal);
  value::~value(&vStack_68);
  value::~value(&local_40);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const expression_statement& s) {
        return completion{get_value(eval(s.e()))};
    }